

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.c
# Opt level: O3

ZyanStatus
ZydisCalcAbsoluteAddressEx
          (ZydisDecodedInstruction *instruction,ZydisDecodedOperand *operand,ZyanU64 runtime_address
          ,ZydisRegisterContext *register_context,ZyanU64 *result_address)

{
  ZyanU8 ZVar1;
  ZydisRegister ZVar2;
  ZyanStatus ZVar3;
  ulong uVar4;
  ZyanU64 ZVar5;
  undefined4 in_R9D;
  int iVar6;
  undefined1 auVar7 [16];
  
  auVar7._0_4_ = -(uint)(instruction == (ZydisDecodedInstruction *)0x0);
  auVar7._4_4_ = -(uint)(operand == (ZydisDecodedOperand *)0x0);
  auVar7._8_4_ = -(uint)(register_context == (ZydisRegisterContext *)0x0);
  auVar7._12_4_ = -(uint)(result_address == (ZyanU64 *)0x0);
  iVar6 = movmskps(in_R9D,auVar7);
  if (iVar6 != 0) {
    return 0x80100004;
  }
  if (operand->type == ZYDIS_OPERAND_TYPE_REGISTER) {
    ZVar5 = register_context->values[(operand->field_10).mem.type];
  }
  else {
    if (operand->type != ZYDIS_OPERAND_TYPE_MEMORY) {
LAB_0011621b:
      ZVar3 = ZydisCalcAbsoluteAddress(instruction,operand,runtime_address,result_address);
      return ZVar3;
    }
    ZVar2 = (operand->field_10).mem.base;
    if ((ulong)ZVar2 == 0) {
      if ((operand->field_10).mem.index == ZYDIS_REGISTER_NONE) goto LAB_0011621b;
      ZVar5 = (operand->field_10).mem.disp.value;
    }
    else {
      if ((ZVar2 & ~ZYDIS_REGISTER_AL) == ZYDIS_REGISTER_EIP) goto LAB_0011621b;
      ZVar5 = register_context->values[ZVar2] + (operand->field_10).mem.disp.value;
    }
    uVar4 = (ulong)(operand->field_10).mem.index;
    if (uVar4 != 0) {
      ZVar5 = ZVar5 + (ulong)(operand->field_10).mem.scale * register_context->values[uVar4];
    }
  }
  ZVar1 = instruction->address_width;
  if (ZVar1 == '@') {
    *result_address = ZVar5;
  }
  else {
    if (ZVar1 == ' ') {
      uVar4 = ZVar5 & 0xffffffff;
    }
    else {
      if (ZVar1 != '\x10') {
        return 0x80100004;
      }
      uVar4 = ZVar5 & 0xffff;
    }
    *result_address = uVar4;
  }
  return 0x100000;
}

Assistant:

ZyanStatus ZydisCalcAbsoluteAddressEx(const ZydisDecodedInstruction* instruction,
    const ZydisDecodedOperand* operand, ZyanU64 runtime_address,
    const ZydisRegisterContext* register_context, ZyanU64* result_address)
{
    // TODO: Test this with AGEN/MIB operands
    // TODO: Add support for Gather/Scatter instructions

    if (!instruction || !operand || !register_context || !result_address)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    if ((operand->type != ZYDIS_OPERAND_TYPE_REGISTER) &&
        ((operand->type != ZYDIS_OPERAND_TYPE_MEMORY) ||
        ((operand->mem.base == ZYDIS_REGISTER_NONE) &&
         (operand->mem.index == ZYDIS_REGISTER_NONE)) ||
        (operand->mem.base == ZYDIS_REGISTER_EIP) ||
        (operand->mem.base == ZYDIS_REGISTER_RIP)))
    {
        return ZydisCalcAbsoluteAddress(instruction, operand, runtime_address, result_address);
    }

    ZyanU64 value;
    if (operand->type == ZYDIS_OPERAND_TYPE_REGISTER)
    {
        value = register_context->values[operand->reg.value];
    }
    else if (operand->type == ZYDIS_OPERAND_TYPE_MEMORY)
    {
        value = operand->mem.disp.value;
        if (operand->mem.base)
        {
            value += register_context->values[operand->mem.base];
        }
        if (operand->mem.index)
        {
            value += register_context->values[operand->mem.index] * operand->mem.scale;
        }
    }
    else
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    switch (instruction->address_width)
    {
    case 16:
        *result_address = value & 0x000000000000FFFF;
        return ZYAN_STATUS_SUCCESS;
    case 32:
        *result_address = value & 0x00000000FFFFFFFF;
        return ZYAN_STATUS_SUCCESS;
    case 64:
        *result_address = value;
        return ZYAN_STATUS_SUCCESS;
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }
}